

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_dependency.cpp
# Opt level: O2

LogicalDependency *
duckdb::LogicalDependency::Deserialize
          (LogicalDependency *__return_storage_ptr__,Deserializer *deserializer)

{
  optional_ptr<duckdb::Catalog,_true> catalog_p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> catalog;
  string local_c0;
  CatalogEntryInfo local_a0;
  CatalogEntryInfo entry;
  
  Deserializer::ReadProperty<duckdb::CatalogEntryInfo>(&entry,deserializer,100,"entry");
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(&catalog,deserializer,0x65,"catalog");
  catalog_p = SerializationData::TryGet<duckdb::Catalog>(&deserializer->data);
  CatalogEntryInfo::CatalogEntryInfo(&local_a0,&entry);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)catalog._M_dataplus._M_p == &catalog.field_2) {
    local_c0.field_2._8_8_ = catalog.field_2._8_8_;
  }
  else {
    local_c0._M_dataplus._M_p = catalog._M_dataplus._M_p;
  }
  local_c0._M_string_length = catalog._M_string_length;
  catalog._M_string_length = 0;
  catalog.field_2._M_local_buf[0] = '\0';
  catalog._M_dataplus._M_p = (pointer)&catalog.field_2;
  LogicalDependency(__return_storage_ptr__,catalog_p,&local_a0,&local_c0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  CatalogEntryInfo::~CatalogEntryInfo(&local_a0);
  ::std::__cxx11::string::~string((string *)&catalog);
  CatalogEntryInfo::~CatalogEntryInfo(&entry);
  return __return_storage_ptr__;
}

Assistant:

LogicalDependency LogicalDependency::Deserialize(Deserializer &deserializer) {
	auto entry = deserializer.ReadProperty<CatalogEntryInfo>(100, "entry");
	auto catalog = deserializer.ReadPropertyWithDefault<string>(101, "catalog");
	LogicalDependency result(deserializer.TryGet<Catalog>(), entry, std::move(catalog));
	return result;
}